

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

Node * __thiscall State::LookupNode(State *this,StringPiece path)

{
  Metrics *this_00;
  bool bVar1;
  int iVar2;
  Metric *pMVar3;
  pointer pvVar4;
  Metric *local_b0;
  _Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> local_80;
  _Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> local_78;
  const_iterator i;
  ScopedMetric metrics_h_scoped;
  allocator<char> local_49;
  string local_48;
  State *local_28;
  State *this_local;
  StringPiece path_local;
  
  path_local.str_ = (char *)path.len_;
  this_local = (State *)path.str_;
  local_28 = this;
  if ((LookupNode(StringPiece)::metrics_h_metric == '\0') &&
     (iVar2 = __cxa_guard_acquire(&LookupNode(StringPiece)::metrics_h_metric), this_00 = g_metrics,
     iVar2 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      local_b0 = (Metric *)0x0;
      LookupNode::metrics_h_metric = local_b0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"lookup node",&local_49);
      pMVar3 = Metrics::NewMetric(this_00,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      LookupNode::metrics_h_metric = pMVar3;
    }
    __cxa_guard_release(&LookupNode(StringPiece)::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)&i,LookupNode::metrics_h_metric);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
       ::find(&this->paths_,(key_type *)&this_local);
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
       ::end(&this->paths_);
  bVar1 = std::__detail::operator!=(&local_78,&local_80);
  if (bVar1) {
    pvVar4 = std::__detail::_Node_const_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *
                          )&local_78);
    path_local.len_ = (size_t)pvVar4->second;
  }
  else {
    path_local.len_ = 0;
  }
  ScopedMetric::~ScopedMetric((ScopedMetric *)&i);
  return (Node *)path_local.len_;
}

Assistant:

Node* State::LookupNode(StringPiece path) const {
  METRIC_RECORD("lookup node");
  Paths::const_iterator i = paths_.find(path);
  if (i != paths_.end())
    return i->second;
  return NULL;
}